

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int i;
  ulong uVar1;
  long lVar2;
  
  IM_DELETE<char>(this->Name);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 != (uint)(this->ColumnsStorage).Size; uVar1 = uVar1 + 1) {
    ImGuiOldColumns::~ImGuiOldColumns
              ((ImGuiOldColumns *)((long)&((this->ColumnsStorage).Data)->ID + lVar2));
    lVar2 = lVar2 + 0x88;
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  ImVector<ImGuiOldColumns>::~ImVector(&this->ColumnsStorage);
  ImVector<ImGuiStorage::ImGuiStoragePair>::~ImVector(&(this->StateStorage).Data);
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  ImVector<unsigned_int>::~ImVector(&this->IDStack);
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiOldColumns();
}